

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O3

bool __thiscall dxil_spv::MemoryStream::map_string_iterate(MemoryStream *this,char **str)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->blob_offset;
  *str = (char *)(this->blob + uVar2);
  do {
    uVar3 = uVar2 + 1;
    if (this->blob_size < uVar3) break;
    uVar1 = this->blob[uVar2];
    this->blob_offset = uVar3;
    uVar2 = uVar3;
  } while (uVar1 != '\0');
  return uVar3 <= this->blob_size;
}

Assistant:

bool MemoryStream::map_string_iterate(const char *&str)
{
	// Strings are C strings and can be mapped 1:1.
	// Just need to verify they terminate properly.
	str = reinterpret_cast<const char *>(blob + blob_offset);
	char c;

	do
	{
		if (!read(c))
			return false;
		else if (c == '\0')
			break;
	} while (c != '\0');

	return true;
}